

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O0

void save_tx(storage_t *st,void *key,size_t keylen,tx_type_t type)

{
  fdb_status fVar1;
  void *__s;
  undefined2 in_CX;
  size_t in_RDX;
  void *in_RSI;
  fdb_status status;
  transaction_t *tx;
  char txkey [12];
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  size_t in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  fdb_kvs_handle *in_stack_ffffffffffffffa8;
  timeval local_30;
  undefined2 local_1a;
  size_t local_18;
  void *local_10;
  
  local_1a = in_CX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  gen_random((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  __s = malloc(0x418);
  memset(__s,0,0x418);
  *(undefined2 *)((long)__s + 0x410) = local_1a;
  *(size_t *)((long)__s + 0x408) = local_18;
  memcpy((void *)((long)__s + 4),local_10,local_18);
  fVar1 = fdb_set_kv(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0xa2);
    save_tx::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0xa2,"void save_tx(storage_t *, void *, size_t, tx_type_t)");
    }
  }
  free(__s);
  return;
}

Assistant:

void save_tx(storage_t *st, void *key, size_t keylen, tx_type_t type){

    TEST_INIT();
    char txkey[12];
    transaction_t *tx = NULL;
    fdb_status status;

    gen_random(txkey, 12);
    tx = (transaction_t*)malloc(sizeof(transaction_t));
    memset(tx, 0, sizeof(transaction_t));
    tx->type = type;
    tx->refkey_len = keylen;
    memcpy(tx->refkey, key, keylen);

    status = fdb_set_kv(st->rtx, txkey, 12,
                        tx, sizeof(transaction_t));
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    free(tx);
    tx=NULL;

}